

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinR2SCANL_C>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *pdVar1;
  long lVar2;
  double vlb;
  double vla;
  double local_40;
  double local_38;
  
  if (0 < N) {
    pdVar1 = sigma + 2;
    lVar2 = 0;
    do {
      kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_C,_ExchCXX::BuiltinPC07OPT_K>_>::
      eval_exc_vxc_polar(*(double *)((long)rho + lVar2),*(double *)((long)rho + lVar2 + 8),
                         pdVar1[-2],pdVar1[-1],*pdVar1,*(double *)((long)lapl + lVar2),
                         *(double *)((long)lapl + lVar2 + 8),*(double *)((long)tau + lVar2),
                         *(double *)((long)tau + lVar2 + 8),eps,(double *)((long)vrho + lVar2),
                         (double *)((long)vrho + lVar2 + 8),vsigma,vsigma + 1,vsigma + 2,&local_38,
                         &local_40,(double *)((long)vtau + lVar2),(double *)((long)vtau + lVar2 + 8)
                        );
      *(double *)((long)vlapl + lVar2) = local_38;
      *(double *)((long)vlapl + lVar2 + 8) = local_40;
      vsigma = vsigma + 3;
      pdVar1 = pdVar1 + 3;
      lVar2 = lVar2 + 0x10;
      eps = eps + 1;
    } while ((ulong)(uint)N << 4 != lVar2);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;


    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double vla, vlb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      eps[i], vrho_i[0], vrho_i[1],
      vsigma_i[0], vsigma_i[1], vsigma_i[2], vla, vlb,
      vtau_i[0], vtau_i[1] );
    if(traits::needs_laplacian) {
      vlapl_i[0] = vla;
      vlapl_i[1] = vlb;
    }

  }

}